

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_init.c
# Opt level: O0

int mtx_init(mtx_t *mtx,int type)

{
  undefined1 local_68 [8];
  _PDCLIB_mtx_t plain_mutex;
  _PDCLIB_mtx_t recursive_mutex;
  mtx_t *pmStack_10;
  int type_local;
  mtx_t *mtx_local;
  
  recursive_mutex._36_4_ = type;
  pmStack_10 = mtx;
  if ((type & 1U) == 0) {
    memset(local_68,0,0x28);
    memcpy(pmStack_10,local_68,0x28);
  }
  else {
    memset(plain_mutex._PDCLIB_mtx_t_data + 0x20,0,0x28);
    recursive_mutex._PDCLIB_mtx_t_data[8] = '\x01';
    memcpy(pmStack_10,plain_mutex._PDCLIB_mtx_t_data + 0x20,0x28);
  }
  return 1;
}

Assistant:

int mtx_init( mtx_t * mtx, int type )
{
    /* As far as I could figure out from Pthread documentation, there is
       no special requirement for a Pthread mutex to support timeout (the
       default "fast" mutex already supports that). So the only thing we
       check for in type is whether the mutex shall be recursive or not.
    */
    if ( type & mtx_recursive )
    {
        _PDCLIB_mtx_t recursive_mutex = _PDCLIB_MTX_RECURSIVE_INIT;
        *mtx = recursive_mutex;
    }
    else
    {
        _PDCLIB_mtx_t plain_mutex = _PDCLIB_MTX_PLAIN_INIT;
        *mtx = plain_mutex;
    }

    return thrd_success;
}